

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManPrintChoiceStats(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  Gia_Man_t *pGVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  uint uVar8;
  
  pGVar5 = p;
  Gia_ManMarkFanoutDrivers(p);
  uVar1 = p->nObjs;
  if ((long)(int)uVar1 < 1) {
LAB_0021878d:
    uVar4 = 0;
    uVar3 = 0;
  }
  else {
    pGVar2 = p->pObjs;
    pGVar5 = (Gia_Man_t *)0x0;
    uVar3 = 0;
    uVar4 = 0;
    pGVar6 = pGVar2;
    do {
      if (pGVar2 == (Gia_Obj_t *)0x0) goto LAB_0021878d;
      uVar7 = (uint)*(undefined8 *)pGVar6;
      if (((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) && (p->pSibls != (int *)0x0)) {
        uVar8 = p->pSibls[(long)pGVar5];
        if ((ulong)uVar8 != 0) {
          if (((int)uVar8 < 0) || (uVar1 <= uVar8)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar8 = (uint)*(undefined8 *)(pGVar2 + uVar8);
          if ((uVar8 >> 0x1e & 1) != 0) {
            __assert_fail("!Gia_ObjSiblObj(p, i)->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                          ,0x19c,"void Gia_ManPrintChoiceStats(Gia_Man_t *)");
          }
          if (((int)uVar8 < 0) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(Gia_ObjSiblObj(p, i))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                          ,0x19d,"void Gia_ManPrintChoiceStats(Gia_Man_t *)");
          }
          uVar4 = (ulong)((int)uVar4 + 1);
          uVar3 = (ulong)((uVar7 >> 0x1e) + (int)uVar3);
        }
      }
      pGVar5 = (Gia_Man_t *)((long)&pGVar5->pName + 1);
      pGVar6 = pGVar6 + 1;
    } while ((Gia_Man_t *)(long)(int)uVar1 != pGVar5);
  }
  Abc_Print((int)pGVar5,"Choice stats: Equivs =%7d. Choices =%7d.\n",uVar4,uVar3);
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManPrintChoiceStats( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nEquivs = 0, nChoices = 0;
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjSibl(p, i) )
            continue;
        nEquivs++;
        if ( pObj->fMark0 )
            nChoices++;
        assert( !Gia_ObjSiblObj(p, i)->fMark0 );
        assert( Gia_ObjIsAnd(Gia_ObjSiblObj(p, i)) );
    }
    Abc_Print( 1, "Choice stats: Equivs =%7d. Choices =%7d.\n", nEquivs, nChoices );
    Gia_ManCleanMark0( p );
}